

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

ssize_t __thiscall jessilib::config::write(config *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  string local_60;
  lock_guard<std::shared_mutex> local_30;
  lock_guard<std::shared_mutex> guard;
  text_encoding in_encoding_local;
  string *in_format_local;
  path *in_filename_local;
  config *this_local;
  
  guard._M_device._4_4_ = (text_encoding)__n;
  bVar1 = std::filesystem::__cxx11::path::empty((path *)CONCAT44(in_register_00000034,__fd));
  impl::_assert_helper
            (!bVar1,
             "Failed assertion: \'!in_filename.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:102"
            );
  std::lock_guard<std::shared_mutex>::lock_guard(&local_30,&this->m_mutex);
  std::filesystem::__cxx11::path::operator=
            (&this->m_filename,(path *)CONCAT44(in_register_00000034,__fd));
  get_format(&local_60,&this->m_filename,(string *)__buf);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_format,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this->m_encoding = guard._M_device._4_4_;
  write_object(&this->m_data,&this->m_filename,&this->m_format,this->m_encoding);
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_30);
  return extraout_RAX;
}

Assistant:

void config::write(const std::filesystem::path& in_filename , const std::string& in_format, text_encoding in_encoding) {
	jessilib_assert(!in_filename.empty());
	std::lock_guard<std::shared_mutex> guard{ m_mutex };

	// Setup
	m_filename = in_filename;
	m_format = get_format(m_filename, in_format);
	m_encoding = in_encoding;

	// Write
	write_object(m_data, m_filename, m_format, m_encoding);
}